

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AtomicCounterSimple::Run(AtomicCounterSimple *this)

{
  CallLogWrapper *pCVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  long lVar4;
  GLuint program;
  mapped_type *pmVar5;
  iterator iVar6;
  long lVar7;
  long lVar8;
  GLint res;
  allocator<char> local_2099;
  long error;
  GLenum prop;
  GLsizei length;
  CallLogWrapper *local_2088;
  GLenum prop2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  GLenum props2 [3];
  key_type local_2038;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLint expected [4];
  GLenum props [4];
  GLint expected3 [3];
  GLint expected2 [3];
  GLint param [1000];
  GLint param2 [1000];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(param,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(param2,this);
  program = PIQBase::CreateProgram
                      ((PIQBase *)this,(char *)param._0_8_,(char *)CONCAT44(param2[1],param2[0]),
                       false);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  pCVar1 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(pCVar1,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(pCVar1,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92c0,0x92f5,3,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92c0,0x92f7,2,&error);
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)&exp);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"a",(allocator<char> *)&exp2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)&exp);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)&exp);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"c",(allocator<char> *)&exp2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)&exp);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param2,"d[0]",(allocator<char> *)&exp2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)&exp);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar3 = *pmVar5;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"e",(allocator<char> *)&exp2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar3,param2,&error);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[0]",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[1]",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)param,"d[2]",(allocator<char> *)param2);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)param);
  prop = 0x9301;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  props[0] = 0x9302;
  props[1] = 0x9303;
  props[2] = 0x9304;
  props[3] = 0x9305;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected[0] = 1;
  expected[1] = 4;
  expected[2] = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"a",(allocator<char> *)param2);
  local_2088 = pCVar1;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  expected[3] = *pmVar5;
  std::__cxx11::string::~string((string *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,4,props,4,expected,&error);
  props2[0] = 0x9302;
  props2[1] = 0x9303;
  props2[2] = 0x9304;
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"b",(allocator<char> *)param2);
  pCVar1 = local_2088;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected2[0] = 2;
  expected2[1] = 8;
  expected2[2] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"c",(allocator<char> *)param2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"d",(allocator<char> *)param2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  expected3[0] = 5;
  expected3[1] = 0x10;
  expected3[2] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)param,"e",(allocator<char> *)param2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  prop2 = 0x9305;
  p_Var2 = &exp._M_t._M_impl.super__Rb_tree_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar5);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"c",(allocator<char> *)&exp2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar5);
  std::__cxx11::string::~string((string *)param2);
  std::__cxx11::string::string<std::allocator<char>>((string *)param2,"b",(allocator<char> *)&exp2);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
  std::__cxx11::string::~string((string *)param2);
  glu::CallLogWrapper::glGetProgramResourceiv(pCVar1,program,0x92c0,res,1,&prop2,1000,&length,param)
  ;
  lVar7 = (long)length;
  lVar4 = 0;
  do {
    lVar8 = lVar4;
    if (lVar7 <= lVar8) {
      anon_unknown_0::Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
      p_Var2 = &exp2._M_t._M_impl.super__Rb_tree_header;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      exp2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2038,"d",&local_2099);
      pCVar1 = local_2088;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2038);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&exp2,pmVar5);
      std::__cxx11::string::~string((string *)&local_2038);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2038,"e",&local_2099);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2038);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&exp2,pmVar5);
      std::__cxx11::string::~string((string *)&local_2038);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2038,"d",&local_2099);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&indicesU,&local_2038);
      glu::CallLogWrapper::glGetProgramResourceiv
                (pCVar1,program,0x92e1,*pmVar5,1,&prop,1000,&length,&res);
      std::__cxx11::string::~string((string *)&local_2038);
      glu::CallLogWrapper::glGetProgramResourceiv
                (pCVar1,program,0x92c0,res,1,&prop2,1000,&length,param2);
      lVar7 = (long)length;
      lVar4 = 0;
      goto LAB_009b3884;
    }
    param2[0] = param[lVar8];
    iVar6 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&exp._M_t,(key_type *)param2);
  } while (((_Rb_tree_header *)iVar6._M_node != p_Var2) &&
          (lVar7 = 2, lVar4 = lVar8 + 1, length == 2));
  anon_unknown_0::Output("Length: %d\n");
  anon_unknown_0::Output
            ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
             (ulong)(uint)param[lVar8]);
  glu::CallLogWrapper::glDeleteProgram(local_2088,program);
  lVar7 = -1;
  goto LAB_009b3905;
  while( true ) {
    local_2038._M_dataplus._M_p._0_4_ = param2[lVar8];
    iVar6 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&exp2._M_t,(key_type *)&local_2038);
    if (((_Rb_tree_header *)iVar6._M_node == p_Var2) || (lVar7 = 2, lVar4 = lVar8 + 1, length != 2))
    break;
LAB_009b3884:
    lVar8 = lVar4;
    if (lVar7 <= lVar8) {
      glu::CallLogWrapper::glDeleteProgram(local_2088,program);
      lVar7 = error;
      goto LAB_009b38f8;
    }
  }
  anon_unknown_0::Output("Length: %d\n");
  anon_unknown_0::Output
            ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
             (ulong)(uint)param[lVar8 + 1000]);
  glu::CallLogWrapper::glDeleteProgram(local_2088,program);
  lVar7 = -1;
LAB_009b38f8:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp2._M_t);
LAB_009b3905:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  return lVar7;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 2, error);

		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "e", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[1]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[2]", -1, error);

		GLenum		  prop	= GL_ATOMIC_COUNTER_BUFFER_INDEX;
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  res;
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);

		GLenum props[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES, GL_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);
		GLint expected[] = { 1, 4, 1, static_cast<GLint>(indicesU["a"]) };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 4, props, 4, expected, error);

		GLenum props2[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		GLint expected2[] = { 2, 8, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["c"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);

		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		GLint expected3[] = { 5, 16, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["e"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);

		GLenum			 prop2 = GL_ACTIVE_VARIABLES;
		GLint			 param[bufSize];
		std::set<GLuint> exp;
		exp.insert(indicesU["b"]);
		exp.insert(indicesU["c"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}
		Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
		std::set<GLuint> exp2;
		GLint			 param2[bufSize];
		exp2.insert(indicesU["d"]);
		exp2.insert(indicesU["e"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param2);
		for (int i = 0; i < length; ++i)
		{
			if (exp2.find(param2[i]) == exp2.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param2[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}

		glDeleteProgram(program);
		return error;
	}